

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_core.cpp
# Opt level: O3

void QTest::qWait(milliseconds msecs)

{
  bool bVar1;
  ulong in_RCX;
  ulong uVar2;
  milliseconds msecs_00;
  long in_FS_OFFSET;
  QDeadlineTimer deadline;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000l>>
            ((QDeadlineTimer *)local_38,(duration<long,_std::ratio<1L,_1000L>_>)msecs.__r,
             PreciseTimer);
  do {
    deadline.t2 = (int)in_RCX;
    deadline.type = (int)(in_RCX >> 0x20);
    deadline.t1 = local_38._8_8_;
    QCoreApplication::processEvents
              ((QCoreApplication *)0x0,
               (QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)SUB84(local_38._0_8_,0),
               deadline);
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    if ((undefined1 *)local_38._0_8_ == (undefined1 *)0x7fffffffffffffff) break;
    in_RCX = QDeadlineTimer::rawRemainingTimeNSecs((QDeadlineTimer *)local_38);
    uVar2 = 0;
    if (0 < (long)in_RCX) {
      uVar2 = in_RCX;
    }
    uVar2 = uVar2 / 1000000;
    msecs_00.__r = (in_RCX != uVar2 * 1000000 &&
                   SBORROW8(in_RCX,uVar2 * 1000000) == (long)(in_RCX + uVar2 * -1000000) < 0) +
                   uVar2;
    if (msecs_00.__r == 0) break;
    if (9 < (ulong)msecs_00.__r) {
      msecs_00.__r = 10;
    }
    qSleep(msecs_00);
    bVar1 = QDeadlineTimer::hasExpired((QDeadlineTimer *)local_38);
  } while (!bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT void QTest::qWait(std::chrono::milliseconds msecs)
{
    // Ideally this method would be implemented in terms of qWaitFor(), with a
    // predicate that always returns false, but qWaitFor() uses the 1-arg overload
    // of processEvents(), which doesn't handle events posted in this round of event
    // processing, which, together with the 10ms qSleep() after every processEvents(),
    // lead to a 10x slow-down in some webengine tests.

    Q_ASSERT(QCoreApplication::instance());

    using namespace std::chrono;

    QDeadlineTimer deadline(msecs, Qt::PreciseTimer);

    do {
        QCoreApplication::processEvents(QEventLoop::AllEvents, deadline);
        QCoreApplication::sendPostedEvents(nullptr, QEvent::DeferredDelete);

        // If dealine is Forever, processEvents() has already looped forever
        if (deadline.isForever())
            break;

        msecs = ceil<milliseconds>(deadline.remainingTimeAsDuration());
        if (msecs == 0ms)
            break;

        QTest::qSleep(std::min(10ms, msecs));
    } while (!deadline.hasExpired());
}